

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O2

ztast_expr_t * ztast_expr_from_value(ztast_t *ast,ztast_value_t *value)

{
  ztast_expr_t *pzVar1;
  
  pzVar1 = (ztast_expr_t *)(*ast->mallocfn)(0x10,ast->opaque);
  if (pzVar1 != (ztast_expr_t *)0x0) {
    pzVar1->type = ZTEXPR_VALUE;
    (pzVar1->data).value = value;
  }
  return pzVar1;
}

Assistant:

ztast_expr_t *ztast_expr_from_value(ztast_t *ast, ztast_value_t *value)
{
  ztast_expr_t *expr;

  assert(ast);
  assert(value);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_expr_from_value\n");
#endif

  expr = ZTAST_MALLOC(sizeof(*expr));
  if (expr == NULL)
    return NULL;

  expr->type       = ZTEXPR_VALUE;
  expr->data.value = value;

  return expr;
}